

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O0

void __thiscall ON_BrepFace::DestroyRuntimeCache(ON_BrepFace *this,bool bDelete)

{
  bool bDelete_local;
  ON_BrepFace *this_local;
  
  ON_SurfaceProxy::DestroyRuntimeCache(&this->super_ON_SurfaceProxy,bDelete);
  ON_BoundingBox::Destroy(&this->m_bbox);
  return;
}

Assistant:

void ON_BrepFace::DestroyRuntimeCache( bool bDelete )
{
  ON_SurfaceProxy::DestroyRuntimeCache(bDelete);

  // 15 August 2003 Dale Lear:
  //    I added the line to destroy the face's m_bbox.
  //    Since m_bbox is private, it will be recalculated
  //    when it is needed.  (We hope.)  The fact the face
  //    m_bbox is private and recalculated as needed makes
  //    it different than the m_pbox info on trims and loops.
  m_bbox.Destroy();
}